

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O1

ChConstraintNgeneric * __thiscall
chrono::ChConstraintNgeneric::operator=(ChConstraintNgeneric *this,ChConstraintNgeneric *other)

{
  if (other != this) {
    ChConstraint::operator=(&this->super_ChConstraint,&other->super_ChConstraint);
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::operator=
              (&this->variables,&other->variables);
    std::
    vector<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_std::allocator<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
    ::operator=(&this->Cq,&other->Cq);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator=(&this->Eq,&other->Eq);
  }
  return this;
}

Assistant:

ChConstraintNgeneric& ChConstraintNgeneric::operator=(const ChConstraintNgeneric& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraint::operator=(other);

    variables = other.variables;
    Cq = other.Cq;
    Eq = other.Eq;

    return *this;
}